

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  bool bVar1;
  byte *pbVar2;
  byte in_CL;
  long lVar3;
  ulong uVar4;
  uint in_EDX;
  ulong *in_RSI;
  byte *in_RDI;
  bool bVar5;
  bool bVar6;
  int jj;
  char *zEnd;
  char *zStart;
  int rc;
  int nonNum;
  int c;
  int i;
  int neg;
  u64 u;
  int incr;
  int local_68;
  int local_64;
  int local_5c;
  byte *local_58;
  int local_44;
  int local_3c;
  uint local_38;
  ulong local_30;
  int local_24;
  byte *local_10;
  int local_4;
  
  local_30 = 0;
  bVar1 = false;
  local_3c = 0;
  bVar5 = false;
  lVar3 = (long)(int)in_EDX;
  if (in_CL == 1) {
    local_24 = 1;
    local_10 = in_RDI;
  }
  else {
    local_24 = 2;
    local_38 = 3 - in_CL;
    while( true ) {
      bVar5 = false;
      if ((int)local_38 < (int)(in_EDX & 0xfffffffe)) {
        bVar5 = in_RDI[(int)local_38] == 0;
      }
      if (!bVar5) break;
      local_38 = local_38 + 2;
    }
    bVar5 = (int)local_38 < (int)(in_EDX & 0xfffffffe);
    lVar3 = (long)(int)(local_38 ^ 1);
    local_10 = in_RDI + (int)(in_CL & 1);
  }
  local_58 = in_RDI + lVar3;
  while( true ) {
    bVar6 = false;
    if (local_10 < local_58) {
      bVar6 = (""[*local_10] & 1) != 0;
    }
    if (!bVar6) break;
    local_10 = local_10 + local_24;
  }
  pbVar2 = local_10;
  if (local_10 < local_58) {
    if (*local_10 == 0x2d) {
      bVar1 = true;
      local_10 = local_10 + local_24;
      pbVar2 = local_10;
    }
    else if (*local_10 == 0x2b) {
      local_10 = local_10 + local_24;
      pbVar2 = local_10;
    }
  }
  while( true ) {
    bVar6 = false;
    if (local_10 < local_58) {
      bVar6 = *local_10 == 0x30;
    }
    if (!bVar6) break;
    local_10 = local_10 + local_24;
  }
  local_38 = 0;
  while( true ) {
    bVar6 = false;
    if (local_10 + (int)local_38 < local_58) {
      local_3c = (int)(char)local_10[(int)local_38];
      bVar6 = false;
      if (0x2f < local_3c) {
        bVar6 = local_3c < 0x3a;
      }
    }
    if (!bVar6) break;
    local_30 = (local_30 * 10 + (long)local_3c) - 0x30;
    local_38 = local_24 + local_38;
  }
  if (local_30 < 0x8000000000000000) {
    if (bVar1) {
      *in_RSI = -local_30;
    }
    else {
      *in_RSI = local_30;
    }
  }
  else {
    uVar4 = 0x7fffffffffffffff;
    if (bVar1) {
      uVar4 = 0x8000000000000000;
    }
    *in_RSI = uVar4;
  }
  local_44 = 0;
  if ((local_38 == 0) && (pbVar2 == local_10)) {
    local_44 = -1;
  }
  else if (bVar5) {
    local_44 = 1;
  }
  else if (local_10 + (int)local_38 < local_58) {
    local_5c = local_38;
    do {
      if ((""[local_10[local_5c]] & 1) == 0) {
        local_44 = 1;
        break;
      }
      local_5c = local_24 + local_5c;
    } while (local_10 + local_5c < local_58);
  }
  if (SBORROW4(local_38,local_24 * 0x13) == (int)(local_38 + local_24 * -0x13) < 0) {
    if (local_38 == local_24 * 0x13 ||
        SBORROW4(local_38,local_24 * 0x13) != (int)(local_38 + local_24 * -0x13) < 0) {
      local_64 = compare2pow63((char *)local_10,local_24);
    }
    else {
      local_64 = 1;
    }
    if (local_64 < 0) {
      local_4 = local_44;
    }
    else {
      uVar4 = 0x7fffffffffffffff;
      if (bVar1) {
        uVar4 = 0x8000000000000000;
      }
      *in_RSI = uVar4;
      if (local_64 < 1) {
        if (bVar1) {
          local_68 = local_44;
        }
        else {
          local_68 = 3;
        }
        local_4 = local_68;
      }
      else {
        local_4 = 2;
      }
    }
  }
  else {
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appease the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( i==0 && zStart==zNum ){    /* No digits */
    rc = -1;
  }else if( nonNum ){            /* UTF16 with high-order bytes non-zero */
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}